

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<24U,_unsigned_char,_void,_false> *x)

{
  uint uVar1;
  unsigned_fast_type uVar2;
  uint_fast8_t base_rep;
  char fill_char_str;
  ostream *poVar3;
  value_type local_1e9;
  uintwide_t<96u,unsigned_short,void,false> *local_1e8;
  unsigned_fast_type local_1e0;
  array<char,_40UL> local_1d8;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  uVar1 = *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  base_rep = '\x10';
  if ((uVar1 & 8) == 0) {
    base_rep = '\n';
  }
  uVar2 = *(unsigned_fast_type *)(out + *(long *)(*(long *)out + -0x18) + 0x10);
  fill_char_str = std::ios::fill();
  if ((uVar1 & 0x40) == 0) {
    if ((uVar1 & 0x48) == 8) {
      local_1d8.elems[0x10] = '\0';
      local_1d8.elems[0x11] = '\0';
      local_1d8.elems[0x12] = '\0';
      local_1d8.elems[0x13] = '\0';
      local_1d8.elems[0x14] = '\0';
      local_1d8.elems[0x15] = '\0';
      local_1d8.elems[0x16] = '\0';
      local_1d8.elems[0x17] = '\0';
      local_1d8.elems[0x18] = '\0';
      local_1d8.elems[0x19] = '\0';
      local_1d8.elems[0x1a] = '\0';
      local_1d8.elems[0x1b] = '\0';
      local_1d8.elems[0x1c] = '\0';
      local_1d8.elems[0x1d] = '\0';
      local_1d8.elems[0x1e] = '\0';
      local_1d8.elems[0x1f] = '\0';
      local_1d8.elems[0] = '\0';
      local_1d8.elems[1] = '\0';
      local_1d8.elems[2] = '\0';
      local_1d8.elems[3] = '\0';
      local_1d8.elems[4] = '\0';
      local_1d8.elems[5] = '\0';
      local_1d8.elems[6] = '\0';
      local_1d8.elems[7] = '\0';
      local_1d8.elems[8] = '\0';
      local_1d8.elems[9] = '\0';
      local_1d8.elems[10] = '\0';
      local_1d8.elems[0xb] = '\0';
      local_1d8.elems[0xc] = '\0';
      local_1d8.elems[0xd] = '\0';
      local_1d8.elems[0xe] = '\0';
      local_1d8.elems[0xf] = '\0';
      local_1e9 = '\0';
      local_1e8 = (uintwide_t<96u,unsigned_short,void,false> *)
                  CONCAT71(local_1e8._1_7_,fill_char_str);
      local_1e0 = uVar2;
      detail::array_detail::array<char,_32UL>::assign((array<char,_32UL> *)&local_1d8,&local_1e9);
      uintwide_t<96u,unsigned_short,void,false>::wr_string<char*>
                ((uintwide_t<96u,unsigned_short,void,false> *)x,local_1d8.elems,base_rep,
                 (bool)((byte)(uVar1 >> 9) & 1),(bool)((byte)(uVar1 >> 0xb) & 1),
                 (bool)((byte)(uVar1 >> 0xe) & 1),local_1e0,(char)local_1e8);
      std::operator<<((ostream *)&ostr,local_1d8.elems);
    }
    else if ((uVar1 & 0x48) == 0) {
      local_1d8.elems[0x10] = '\0';
      local_1d8.elems[0x11] = '\0';
      local_1d8.elems[0x12] = '\0';
      local_1d8.elems[0x13] = '\0';
      local_1d8.elems[0x14] = '\0';
      local_1d8.elems[0x15] = '\0';
      local_1d8.elems[0x16] = '\0';
      local_1d8.elems[0x17] = '\0';
      local_1d8.elems[0x18] = '\0';
      local_1d8.elems[0x19] = '\0';
      local_1d8.elems[0x1a] = '\0';
      local_1d8.elems[0x1b] = '\0';
      local_1d8.elems[0x1c] = '\0';
      local_1d8.elems[0x1d] = '\0';
      local_1d8.elems[0x1e] = '\0';
      local_1d8.elems[0x1f] = '\0';
      local_1d8.elems[0x20] = '\0';
      local_1d8.elems[0x21] = '\0';
      local_1d8.elems[0x22] = '\0';
      local_1d8.elems[0x23] = '\0';
      local_1d8.elems[0x24] = '\0';
      local_1d8.elems[0x25] = '\0';
      local_1d8.elems[0] = '\0';
      local_1d8.elems[1] = '\0';
      local_1d8.elems[2] = '\0';
      local_1d8.elems[3] = '\0';
      local_1d8.elems[4] = '\0';
      local_1d8.elems[5] = '\0';
      local_1d8.elems[6] = '\0';
      local_1d8.elems[7] = '\0';
      local_1d8.elems[8] = '\0';
      local_1d8.elems[9] = '\0';
      local_1d8.elems[10] = '\0';
      local_1d8.elems[0xb] = '\0';
      local_1d8.elems[0xc] = '\0';
      local_1d8.elems[0xd] = '\0';
      local_1d8.elems[0xe] = '\0';
      local_1d8.elems[0xf] = '\0';
      local_1e9 = '\0';
      local_1e8 = (uintwide_t<96u,unsigned_short,void,false> *)
                  CONCAT71(local_1e8._1_7_,fill_char_str);
      local_1e0 = uVar2;
      detail::array_detail::array<char,_38UL>::assign((array<char,_38UL> *)&local_1d8,&local_1e9);
      uintwide_t<96u,unsigned_short,void,false>::wr_string<char*>
                ((uintwide_t<96u,unsigned_short,void,false> *)x,local_1d8.elems,base_rep,
                 (bool)((byte)(uVar1 >> 9) & 1),(bool)((byte)(uVar1 >> 0xb) & 1),
                 (bool)((byte)(uVar1 >> 0xe) & 1),local_1e0,(char)local_1e8);
      std::operator<<((ostream *)&ostr,local_1d8.elems);
    }
  }
  else {
    local_1d8.elems[0x20] = '\0';
    local_1d8.elems[0x21] = '\0';
    local_1d8.elems[0x22] = '\0';
    local_1d8.elems[0x23] = '\0';
    local_1d8.elems[0x24] = '\0';
    local_1d8.elems[0x25] = '\0';
    local_1d8.elems[0x26] = '\0';
    local_1d8.elems[0x27] = '\0';
    local_1d8.elems[0x10] = '\0';
    local_1d8.elems[0x11] = '\0';
    local_1d8.elems[0x12] = '\0';
    local_1d8.elems[0x13] = '\0';
    local_1d8.elems[0x14] = '\0';
    local_1d8.elems[0x15] = '\0';
    local_1d8.elems[0x16] = '\0';
    local_1d8.elems[0x17] = '\0';
    local_1d8.elems[0x18] = '\0';
    local_1d8.elems[0x19] = '\0';
    local_1d8.elems[0x1a] = '\0';
    local_1d8.elems[0x1b] = '\0';
    local_1d8.elems[0x1c] = '\0';
    local_1d8.elems[0x1d] = '\0';
    local_1d8.elems[0x1e] = '\0';
    local_1d8.elems[0x1f] = '\0';
    local_1d8.elems[0] = '\0';
    local_1d8.elems[1] = '\0';
    local_1d8.elems[2] = '\0';
    local_1d8.elems[3] = '\0';
    local_1d8.elems[4] = '\0';
    local_1d8.elems[5] = '\0';
    local_1d8.elems[6] = '\0';
    local_1d8.elems[7] = '\0';
    local_1d8.elems[8] = '\0';
    local_1d8.elems[9] = '\0';
    local_1d8.elems[10] = '\0';
    local_1d8.elems[0xb] = '\0';
    local_1d8.elems[0xc] = '\0';
    local_1d8.elems[0xd] = '\0';
    local_1d8.elems[0xe] = '\0';
    local_1d8.elems[0xf] = '\0';
    local_1e9 = '\0';
    local_1e8 = (uintwide_t<96u,unsigned_short,void,false> *)x;
    local_1e0 = uVar2;
    detail::array_detail::array<char,_40UL>::assign(&local_1d8,&local_1e9);
    uintwide_t<96u,unsigned_short,void,false>::wr_string<char*>
              (local_1e8,local_1d8.elems,'\b',(bool)((byte)(uVar1 >> 9) & 1),
               (bool)((byte)(uVar1 >> 0xb) & 1),(bool)((byte)(uVar1 >> 0xe) & 1),local_1e0,
               fill_char_str);
    std::operator<<((ostream *)&ostr,local_1d8.elems);
  }
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(out,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  return poVar3;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }